

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_event_visitor.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::visit_end_array
          (basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *this,
          ser_context *context,error_code *ec)

{
  bool bVar1;
  target_t tVar2;
  reference pvVar3;
  size_type sVar4;
  undefined8 uVar5;
  string *s;
  long in_RDI;
  string *in_stack_ffffffffffffff48;
  level *in_stack_ffffffffffffff50;
  assertion_error *this_00;
  string_view_type *name;
  basic_json_visitor<char> *in_stack_ffffffffffffff60;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  
  pvVar3 = std::
           vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
           ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                   *)in_stack_ffffffffffffff50);
  tVar2 = level::target(pvVar3);
  if (tVar2 == buffer) {
    std::__cxx11::string::push_back((char)in_RDI + '8');
    sVar4 = std::
            vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
            ::size((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                    *)(in_RDI + 0x58));
    if (sVar4 < 2) {
      uVar5 = __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      assertion_error::assertion_error
                ((assertion_error *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      __cxa_throw(uVar5,&assertion_error::typeinfo,assertion_error::~assertion_error);
    }
    std::
    vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
    ::pop_back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                *)0x1a58e0);
    pvVar3 = std::
             vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
             ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                     *)in_stack_ffffffffffffff50);
    tVar2 = level::target(pvVar3);
    if (tVar2 == destination) {
      name = *(string_view_type **)(in_RDI + 0x10);
      std::__cxx11::string::operator_cast_to_basic_string_view((string *)(in_RDI + 0x38));
      basic_json_visitor<char>::key
                (in_stack_ffffffffffffff60,name,(ser_context *)in_stack_ffffffffffffff50,
                 (error_code *)in_stack_ffffffffffffff48);
      std::__cxx11::string::clear();
    }
    else {
      pvVar3 = std::
               vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
               ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                       *)in_stack_ffffffffffffff50);
      bVar1 = level::is_key(pvVar3);
      if (bVar1) {
        std::__cxx11::string::push_back((char)in_RDI + '8');
      }
    }
    std::
    vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
    ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
            *)in_stack_ffffffffffffff50);
    level::advance(in_stack_ffffffffffffff50);
  }
  else {
    sVar4 = std::
            vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
            ::size((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                    *)(in_RDI + 0x58));
    if (sVar4 < 2) {
      s = (string *)__cxa_allocate_exception(0x10);
      this_00 = (assertion_error *)&stack0xffffffffffffff7f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      assertion_error::assertion_error(this_00,s);
      __cxa_throw(s,&assertion_error::typeinfo,assertion_error::~assertion_error);
    }
    std::
    vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
    ::pop_back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                *)0x1a5a6c);
    std::
    vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
    ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
            *)in_stack_ffffffffffffff50);
    level::advance(in_stack_ffffffffffffff50);
    basic_json_visitor<char>::end_array
              ((basic_json_visitor<char> *)in_stack_ffffffffffffff50,
               (ser_context *)in_stack_ffffffffffffff48,(error_code *)0x1a5aa0);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_end_array(const ser_context& context, std::error_code& ec) override
        {
            switch (level_stack_.back().target())
            {
                case target_t::buffer:
                    key_buffer_.push_back(']');
                    JSONCONS_ASSERT(level_stack_.size() > 1);
                    level_stack_.pop_back();
                    if (level_stack_.back().target() == target_t::destination)
                    {
                        destination_->key(key_buffer_, context, ec);
                        key_buffer_.clear();
                    }
                    else if (level_stack_.back().is_key())
                    {
                        key_buffer_.push_back(':');
                    }
                    level_stack_.back().advance();
                    break;
                default:
                    JSONCONS_ASSERT(level_stack_.size() > 1);
                    level_stack_.pop_back();
                    level_stack_.back().advance();
                    destination_->end_array(context, ec);
                    break;
            }
            JSONCONS_VISITOR_RETURN;
        }